

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svgelement.h
# Opt level: O0

void __thiscall
lunasvg::SVGElement::
transverse<lunasvg::Document::applyStyleSheet(std::__cxx11::string_const&)::__0>
          (SVGElement *this,anon_class_8_1_a8973817 callback)

{
  bool bVar1;
  reference node;
  SVGElement *this_00;
  SVGElement *element;
  unique_ptr<lunasvg::SVGNode,_std::default_delete<lunasvg::SVGNode>_> *child;
  iterator __end2;
  iterator __begin2;
  SVGNodeList *__range2;
  SVGElement *this_local;
  anon_class_8_1_a8973817 callback_local;
  
  this_local = (SVGElement *)callback.rules;
  Document::applyStyleSheet::anon_class_8_1_a8973817::operator()
            ((anon_class_8_1_a8973817 *)&this_local,this);
  __end2 = std::__cxx11::
           list<std::unique_ptr<lunasvg::SVGNode,_std::default_delete<lunasvg::SVGNode>_>,_std::allocator<std::unique_ptr<lunasvg::SVGNode,_std::default_delete<lunasvg::SVGNode>_>_>_>
           ::begin(&this->m_children);
  child = (unique_ptr<lunasvg::SVGNode,_std::default_delete<lunasvg::SVGNode>_> *)
          std::__cxx11::
          list<std::unique_ptr<lunasvg::SVGNode,_std::default_delete<lunasvg::SVGNode>_>,_std::allocator<std::unique_ptr<lunasvg::SVGNode,_std::default_delete<lunasvg::SVGNode>_>_>_>
          ::end(&this->m_children);
  while( true ) {
    bVar1 = std::operator!=(&__end2,(_Self *)&child);
    if (!bVar1) break;
    node = std::
           _List_iterator<std::unique_ptr<lunasvg::SVGNode,_std::default_delete<lunasvg::SVGNode>_>_>
           ::operator*(&__end2);
    this_00 = toSVGElement(node);
    if (this_00 != (SVGElement *)0x0) {
      transverse<lunasvg::Document::applyStyleSheet(std::__cxx11::string_const&)::__0>
                (this_00,(anon_class_8_1_a8973817)this_local);
    }
    std::_List_iterator<std::unique_ptr<lunasvg::SVGNode,_std::default_delete<lunasvg::SVGNode>_>_>
    ::operator++(&__end2);
  }
  return;
}

Assistant:

inline void SVGElement::transverse(T callback)
{
    callback(this);
    for(const auto& child : m_children) {
        if(auto element = toSVGElement(child)) {
            element->transverse(callback);
        }
    }
}